

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

void debug_buffer(FILE *fp,bcf_sr_t *reader)

{
  bcf1_t *pbVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  if (-1 < reader->nbuffer) {
    lVar6 = 0;
    do {
      pcVar4 = "";
      if (lVar6 == 0) {
        pcVar4 = "*";
      }
      pbVar1 = reader->buffer[lVar6];
      pcVar3 = "";
      if (*(short *)&pbVar1->field_0x12 != 0) {
        pcVar3 = *(pbVar1->d).allele;
      }
      fprintf((FILE *)fp,"%s%s\t%s:%d\t%s ",reader->fname,pcVar4,
              reader->header->id[1][pbVar1->rid].key,(ulong)(pbVar1->pos + 1),pcVar3);
      if ((*(ushort *)&pbVar1->field_0x12 & 0xfffe) != 0) {
        uVar5 = 1;
        do {
          fprintf((FILE *)fp," %s",(pbVar1->d).allele[uVar5]);
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(ushort *)&pbVar1->field_0x12);
      }
      fputc(10,(FILE *)fp);
      bVar2 = lVar6 < reader->nbuffer;
      lVar6 = lVar6 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void debug_buffer(FILE *fp, bcf_sr_t *reader)
{
    int j;
    for (j=0; j<=reader->nbuffer; j++)
    {
        bcf1_t *line = reader->buffer[j];
        fprintf(fp,"%s%s\t%s:%d\t%s ", reader->fname,j==0?"*":"",reader->header->id[BCF_DT_CTG][line->rid].key,line->pos+1,line->n_allele?line->d.allele[0]:"");
        int k;
        for (k=1; k<line->n_allele; k++) fprintf(fp," %s", line->d.allele[k]);
        fprintf(fp,"\n");
    }
}